

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicClass.cpp
# Opt level: O3

void __thiscall
vkt::geometry::GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
          (GeometryExpanderRenderTestInstance *this,Context *context,
          VkPrimitiveTopology primitiveType,char *name)

{
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  allocator<char> local_29;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_00d4fa58;
  this->m_primitiveType = primitiveType;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_29);
  (this->m_vertexAttrData).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexAttrData).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vertexPosData).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vertexAttrData).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertexPosData).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertexPosData).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  checkGeometryShaderSupport(vki,physDevice,0);
  return;
}

Assistant:

GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance (Context&					context,
																		const VkPrimitiveTopology	primitiveType,
																		const char*					name)
	: TestInstance		(context)
	, m_primitiveType	(primitiveType)
	, m_name			(name)
{
	checkGeometryShaderSupport(context.getInstanceInterface(), context.getPhysicalDevice());
}